

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::InlineCallTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *callFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isCallInstanceFunction)

{
  code *pcVar1;
  FunctionJITTimeInfo *pFVar2;
  Instr *pIVar3;
  Instr *inlinerData_00;
  bool bVar4;
  bool bVar5;
  BuiltinFunction builtInId;
  uint localFuncId;
  Instr *pIVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  RegOpnd *this_00;
  StackSym *pSVar9;
  FunctionJITTimeInfo *inlineeData_00;
  undefined1 safeThis;
  Instr *local_a8;
  Instr *callLdInstr;
  Instr *callTargetLdInstr;
  FunctionJITTimeInfo *inlineeData;
  Instr *callbackDefInstr;
  StackSym *local_80;
  ulong local_78;
  StackSym *local_70;
  InlineCacheIndex local_64;
  OpCode OStack_60;
  InlineCacheIndex inlineCacheIndex;
  Instr *explicitThisArgOut;
  Inline *local_50;
  Instr *local_48;
  Instr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  CallApplyTargetSourceType local_32;
  byte local_31;
  ValueType returnType;
  CallApplyTargetSourceType targetType;
  
  local_a8 = (Instr *)0x0;
  callLdInstr = (Instr *)0x0;
  explicitThisArgOut = (Instr *)pInlineeData;
  bVar4 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&local_a8,&callLdInstr);
  pIVar6 = local_a8;
  if (!bVar4) {
    return false;
  }
  callTargetLdInstr = (Instr *)0x0;
  local_64 = 0xffffffff;
  inlineeData = (FunctionJITTimeInfo *)0x0;
  local_32 = None;
  local_78 = (ulong)isCallInstanceFunction;
  local_48 = callLdInstr;
  local_70 = symCallerThis;
  local_50 = (Inline *)callFuncInfo;
  bVar4 = TryGetCallApplyInlineeData
                    (this,inlinerData,callInstr,local_a8,callLdInstr,
                     (FunctionJITTimeInfo **)&callTargetLdInstr,&local_64,(Instr **)&inlineeData,
                     isCallInstanceFunction,&local_32);
  pIVar8 = callTargetLdInstr;
  if (!bVar4) {
    return false;
  }
  local_40 = (Instr *)inlinerData;
  bVar4 = SkipCallApplyScriptTargetInlining_Shared
                    (this,callInstr,inlinerData,(FunctionJITTimeInfo *)callTargetLdInstr,false,true)
  ;
  pFVar2 = inlineeData;
  if (bVar4) {
    explicitThisArgOut->_vptr_Instr = (_func_int **)pIVar8;
    return false;
  }
  explicitThisArgOut = callInstr;
  bVar4 = FunctionJITTimeInfo::HasBody((FunctionJITTimeInfo *)pIVar8);
  pIVar3 = explicitThisArgOut;
  if (!bVar4) {
    if (pFVar2 != (FunctionJITTimeInfo *)0x0) {
      return false;
    }
    ValueType::ValueType((ValueType *)&local_34.field_0);
    InliningDecider::GetBuiltInInfo
              ((FunctionJITTimeInfo *)pIVar8,&stack0xffffffffffffffa0,(ValueType *)&local_34.field_0
              );
    localFuncId = FunctionJITTimeInfo::GetLocalFunctionId((FunctionJITTimeInfo *)pIVar8);
    builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
    pIVar3 = local_40;
    pIVar6 = explicitThisArgOut;
    if ((byte)(builtInId._value - 0x3c) < 3) {
      return false;
    }
    bVar4 = CanInlineBuiltInFunction
                      (this,explicitThisArgOut,inlineeData_00,OStack_60,
                       (FunctionJITTimeInfo *)local_40,builtInId,true);
    if (!bVar4) {
      return false;
    }
    bVar4 = InlineCallBuiltInTarget
                      (this,pIVar6,(FunctionJITTimeInfo *)pIVar3,(FunctionJITTimeInfo *)pIVar8,
                       (FunctionJITTimeInfo *)local_50,local_48,OStack_60,local_70,
                       recursiveInlineDepth,SUB81(local_78,0),returnInstr);
    return bVar4;
  }
  callbackDefInstr = (Instr *)pFVar2;
  local_80 = IR::Opnd::GetStackSym(explicitThisArgOut->m_src1);
  inlinerData_00 = local_40;
  local_31 = pIVar3->m_src1->field_0xb;
  local_34.bits._0_1_ = '\0';
  local_40 = pIVar8;
  pIVar6 = TryGetFixedMethodsForBuiltInAndTarget
                     (this,pIVar3,(FunctionJITTimeInfo *)inlinerData_00,
                      (FunctionJITTimeInfo *)pIVar8,(FunctionJITTimeInfo *)local_50,pIVar6,local_48,
                      (bool *)&local_34,false,pFVar2 != (FunctionJITTimeInfo *)0x0);
  bVar4 = pIVar6 != (Instr *)0x0;
  if (!bVar4) {
    return bVar4;
  }
  _OStack_60 = (Instr *)0x0;
  local_50 = this;
  AdjustArgoutsForCallTargetInlining
            (this,pIVar3,(Instr **)&stack0xffffffffffffffa0,SUB81(local_78,0));
  if (_OStack_60 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd5d,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar5) goto LAB_0050b69b;
    *puVar7 = 0;
  }
  safeThis = local_34.bits._0_1_;
  if (local_34.bits._0_1_ == '\x01') {
    pIVar8 = IR::Instr::GetBytecodeArgOutCapture(_OStack_60);
    bVar5 = IR::Opnd::IsRegOpnd(pIVar8->m_src1);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_48 = (Instr *)__tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)&local_48->_vptr_Instr = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xd62,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                         "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
      if (!bVar5) {
LAB_0050b69b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)&local_48->_vptr_Instr = 0;
    }
    this_00 = IR::Opnd::AsRegOpnd(pIVar8->m_src1);
    pSVar9 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if (pSVar9 != local_70) {
      safeThis = false;
    }
  }
  pIVar6 = InlineCallApplyTarget_Shared
                     (local_50,pIVar3,(bool)((local_31 & 8) >> 3),local_80,
                      (FunctionJITTimeInfo *)local_40,local_64,(bool)safeThis,false,local_32,
                      callbackDefInstr,recursiveInlineDepth,pIVar6);
  *returnInstr = pIVar6;
  return bVar4;
}

Assistant:

bool
Inline::InlineCallTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *callFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* callLdInstr = nullptr;
    IR::Instr* callTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &callLdInstr, &callTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, callLdInstr, callTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, isCallInstanceFunction, &targetType))
    {
        return false;
    }

    if (SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ false, /*isCallTarget*/ true))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    if (!inlineeData->HasBody())
    {
        if (targetIsCallback)
        {
            return false;
        }

        Js::OpCode builtInInlineOpCode;
        ValueType returnType;
        InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineOpCode, &returnType);
        Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
        switch (builtInId)
        {
        default:
        {
            if (CanInlineBuiltInFunction(callInstr, inlineeData, builtInInlineOpCode, inlinerData, builtInId, true))
            {
                return InlineCallBuiltInTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callTargetLdInstr, builtInInlineOpCode, symCallerThis, recursiveInlineDepth, isCallInstanceFunction, returnInstr);
            }
        }
        case Js::BuiltinFunction::JavascriptFunction_Apply:
        case Js::BuiltinFunction::JavascriptFunction_Call:
        case Js::BuiltinFunction::EngineInterfaceObject_CallInstanceFunction:
            return false;
        }
    }

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    IR::Instr * funcObjCheckInsertInstr = TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callLdInstr, callTargetLdInstr, safeThis, /*isApplyTarget*/ false, targetIsCallback);
    if (!funcObjCheckInsertInstr)
    {
        return false;
    }

    IR::Instr * explicitThisArgOut = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &explicitThisArgOut, isCallInstanceFunction);
    Assert(explicitThisArgOut);

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
        safeThis, /*isApplyTarget*/ false, targetType, callbackDefInstr, recursiveInlineDepth, funcObjCheckInsertInstr);

    return true;
}